

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::AttribSpec::AttribSpec
          (AttribSpec *this,char *name_,Vec4 *p00_,Vec4 *p01_,Vec4 *p10_,Vec4 *p11_)

{
  int i;
  long lVar1;
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name_,&local_29);
  lVar1 = 0;
  do {
    (this->p00).m_data[lVar1] = p00_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    (this->p01).m_data[lVar1] = p01_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    (this->p10).m_data[lVar1] = p10_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    (this->p11).m_data[lVar1] = p11_->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  return;
}

Assistant:

AttribSpec (const char* name_, const tcu::Vec4& p00_, const tcu::Vec4& p01_, const tcu::Vec4& p10_, const tcu::Vec4& p11_)
			: name		(name_)
			, p00		(p00_)
			, p01		(p01_)
			, p10		(p10_)
			, p11		(p11_)
		{
		}